

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  size_t sVar1;
  connectdata *local_38;
  connectdata *conn;
  _Bool *p_Stack_28;
  CURLcode result;
  _Bool *protocol_done_local;
  _Bool *asyncp_local;
  Curl_easy *data_local;
  
  *asyncp = false;
  p_Stack_28 = protocol_done;
  protocol_done_local = asyncp;
  asyncp_local = (_Bool *)data;
  Curl_req_hard_reset(&data->req,data);
  conn._4_4_ = create_conn((Curl_easy *)asyncp_local,&local_38,protocol_done_local);
  if (conn._4_4_ == CURLE_OK) {
    sVar1 = Curl_llist_count(&local_38->easyq);
    if (sVar1 < 2) {
      if ((*protocol_done_local & 1U) == 0) {
        conn._4_4_ = Curl_setup_conn((Curl_easy *)asyncp_local,p_Stack_28);
      }
    }
    else {
      *p_Stack_28 = true;
    }
  }
  if (conn._4_4_ == CURLE_NO_CONNECTION_AVAILABLE) {
    data_local._4_4_ = conn._4_4_;
  }
  else {
    if ((conn._4_4_ != CURLE_OK) && (local_38 != (connectdata *)0x0)) {
      Curl_detach_connection((Curl_easy *)asyncp_local);
      Curl_conn_terminate((Curl_easy *)asyncp_local,local_38,true);
    }
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conn_terminate(data, conn, TRUE);
  }

  return result;
}